

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prob.cpp
# Opt level: O1

int geometric_sample(double a,int *seed)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  iVar1 = (*seed % 0x1f31d) * 0x41a7;
  iVar3 = (*seed / 0x1f31d) * -0xb14;
  iVar2 = iVar1 + iVar3;
  iVar1 = iVar1 + iVar3 + 0x7fffffff;
  if (-1 < iVar2) {
    iVar1 = iVar2;
  }
  *seed = iVar1;
  iVar1 = geometric_cdf_inv((double)iVar1 * 4.656612875e-10,a);
  return iVar1;
}

Assistant:

int geometric_sample ( double a, int &seed )

//****************************************************************************80
//
//  Purpose:
//
//    GEOMETRIC_SAMPLE samples the Geometric PDF.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    16 October 2004
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, double A, the probability of success on one trial.
//    0.0 <= A <= 1.0.
//
//    Input/output, int &SEED, a seed for the random number generator.
//
//    Output, int GEOMETRIC_SAMPLE, a sample of the PDF.
//
{
  double cdf;
  int x;

  cdf = r8_uniform_01 ( seed );

  x = geometric_cdf_inv ( cdf, a );

  return x;
}